

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NtkLevelReverse(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  uint uVar4;
  
  for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkCo(pNtk,iVar3);
    *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xfff;
  }
  Abc_NtkIncrementTravId(pNtk);
  uVar4 = 0;
  for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,iVar3);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
      Abc_NtkLevelReverse_rec(pAVar2);
      uVar1 = *(uint *)&pAVar2->field_0x14 >> 0xc;
      if (uVar4 <= uVar1) {
        uVar4 = uVar1;
      }
    }
  }
  return uVar4;
}

Assistant:

int Abc_NtkLevelReverse( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, LevelsMax;
    // set the CO levels to zero
    Abc_NtkForEachCo( pNtk, pNode, i )
        pNode->Level = 0;
    // perform the traversal
    LevelsMax = 0;
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Abc_NtkLevelReverse_rec( pNode );
        if ( LevelsMax < (int)pNode->Level )
            LevelsMax = (int)pNode->Level;
    }
    return LevelsMax;
}